

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void tcd_free_encode(opj_tcd_t *tcd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_RDI;
  opj_tcd_precinct_t *prc;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  opj_tcd_tilecomp_t *tilec;
  opj_tcd_tile_t *tile;
  int cblkno;
  int precno;
  int bandno;
  int resno;
  int compno;
  int tileno;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 1; local_c = local_c + 1) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x20) + 8);
    for (local_10 = 0; local_10 < *(int *)(lVar1 + 0x10); local_10 = local_10 + 1) {
      lVar2 = *(long *)(lVar1 + 0x18) + (long)local_10 * 0x30;
      for (local_14 = 0; local_14 < *(int *)(lVar2 + 0x10); local_14 = local_14 + 1) {
        lVar3 = *(long *)(lVar2 + 0x18) + (long)local_14 * 0x98;
        for (local_18 = 0; local_18 < *(int *)(lVar3 + 0x18); local_18 = local_18 + 1) {
          lVar4 = lVar3 + 0x20 + (long)local_18 * 0x28;
          for (local_1c = 0; local_1c < *(int *)(lVar3 + 0x10) * *(int *)(lVar3 + 0x14);
              local_1c = local_1c + 1) {
            lVar5 = *(long *)(lVar4 + 0x18) + (long)local_1c * 0x30;
            if (*(long *)(lVar5 + 0x20) != 0) {
              tgt_destroy((opj_tgt_tree_t *)0x2c6cd3);
              *(undefined8 *)(lVar5 + 0x20) = 0;
            }
            if (*(long *)(lVar5 + 0x28) != 0) {
              tgt_destroy((opj_tgt_tree_t *)0x2c6cf7);
              *(undefined8 *)(lVar5 + 0x28) = 0;
            }
            for (local_20 = 0; local_20 < *(int *)(lVar5 + 0x10) * *(int *)(lVar5 + 0x14);
                local_20 = local_20 + 1) {
              free((void *)(*(long *)(*(long *)(lVar5 + 0x18) + (long)local_20 * 0x40) + -2));
              free(*(void **)(*(long *)(lVar5 + 0x18) + (long)local_20 * 0x40 + 8));
              free(*(void **)(*(long *)(lVar5 + 0x18) + (long)local_20 * 0x40 + 0x10));
            }
            free(*(void **)(lVar5 + 0x18));
          }
          free(*(void **)(lVar4 + 0x18));
          *(undefined8 *)(lVar4 + 0x18) = 0;
        }
      }
      free(*(void **)(lVar2 + 0x18));
      *(undefined8 *)(lVar2 + 0x18) = 0;
    }
    free(*(void **)(lVar1 + 0x18));
    *(undefined8 *)(lVar1 + 0x18) = 0;
  }
  free(*(void **)(*(long *)(in_RDI + 0x20) + 8));
  *(undefined8 *)(*(long *)(in_RDI + 0x20) + 8) = 0;
  return;
}

Assistant:

void tcd_free_encode(opj_tcd_t *tcd) {
	int tileno, compno, resno, bandno, precno, cblkno;

	for (tileno = 0; tileno < 1; tileno++) {
		opj_tcd_tile_t *tile = tcd->tcd_image->tiles;

		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];

			for (resno = 0; resno < tilec->numresolutions; resno++) {
				opj_tcd_resolution_t *res = &tilec->resolutions[resno];

				for (bandno = 0; bandno < res->numbands; bandno++) {
					opj_tcd_band_t *band = &res->bands[bandno];

					for (precno = 0; precno < res->pw * res->ph; precno++) {
						opj_tcd_precinct_t *prc = &band->precincts[precno];

						if (prc->incltree != NULL) {
							tgt_destroy(prc->incltree);
							prc->incltree = NULL;
						}
						if (prc->imsbtree != NULL) {
							tgt_destroy(prc->imsbtree);	
							prc->imsbtree = NULL;
						}
						for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
							opj_free(prc->cblks.enc[cblkno].data - 2);
							opj_free(prc->cblks.enc[cblkno].layers);
							opj_free(prc->cblks.enc[cblkno].passes);
						}
						opj_free(prc->cblks.enc);
					} /* for (precno */
					opj_free(band->precincts);
					band->precincts = NULL;
				} /* for (bandno */
			} /* for (resno */
			opj_free(tilec->resolutions);
			tilec->resolutions = NULL;
		} /* for (compno */
		opj_free(tile->comps);
		tile->comps = NULL;
	} /* for (tileno */
	opj_free(tcd->tcd_image->tiles);
	tcd->tcd_image->tiles = NULL;
}